

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase52::run(TestCase52 *this)

{
  uint uVar1;
  ushort uVar2;
  ulong uVar3;
  StructReader reader;
  AlignedData<2> data;
  undefined8 local_80;
  StructReader local_78;
  PointerReader local_48;
  WirePointer local_28;
  undefined8 uStack_20;
  
  local_48.pointer = &local_28;
  local_28.offsetAndKind.value = 0;
  local_28.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x1;
  uStack_20 = 0xefcdab8967452301;
  local_48.segment = (SegmentReader *)0x0;
  local_48.capTable = (CapTableReader *)0x0;
  local_48.nestingLimit = 0x7fffffff;
  PointerReader::getStruct(&local_78,&local_48,(word *)0x0);
  if (local_78.dataSize < 0x40) {
    if (kj::_::Debug::minSeverity < 3) {
      uVar3 = 0;
LAB_001ad4ce:
      local_48.segment = (SegmentReader *)0xefcdab8967452301;
      local_80 = uVar3;
      kj::_::Debug::log<char_const(&)[90],unsigned_long_long,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x3e,ERROR,
                 "\"failed: expected \" \"(0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))\", 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS)"
                 ,(char (*) [90])
                  "failed: expected (0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS))"
                 ,(unsigned_long_long *)&local_48,&local_80);
      goto LAB_001ad507;
    }
LAB_001ad565:
    if (0x1f < local_78.dataSize) goto LAB_001ad586;
    if (kj::_::Debug::minSeverity < 3) {
      uVar1 = 0;
      goto LAB_001ad5a9;
    }
LAB_001ad6ba:
    if (0xf < local_78.dataSize) goto LAB_001ad6db;
    if (kj::_::Debug::minSeverity < 3) {
      uVar2 = 0;
      goto LAB_001ad6ff;
    }
LAB_001adbc9:
    if (local_78.dataSize != 0) goto LAB_001adbcd;
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
LAB_001adbff:
    kj::_::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x51,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(0 * ELEMENTS)\"",
               (char (*) [57])"failed: expected reader.getDataField<bool>(0 * ELEMENTS)");
  }
  else {
    uVar3 = *local_78.data;
    if ((uVar3 != 0xefcdab8967452301) && (kj::_::Debug::minSeverity < 3)) goto LAB_001ad4ce;
LAB_001ad507:
    if (local_78.dataSize < 0x80) goto LAB_001ad565;
    if ((*(SegmentReader **)((long)local_78.data + 8) != (SegmentReader *)0x0) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_80 = local_80 & 0xffffffff00000000;
      local_48.segment = *(SegmentReader **)((long)local_78.data + 8);
      kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x3f,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataField<uint64_t>(1 * ELEMENTS))\", 0u, reader.getDataField<uint64_t>(1 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (0u) == (reader.getDataField<uint64_t>(1 * ELEMENTS))",
                 (uint *)&local_80,(unsigned_long *)&local_48);
      goto LAB_001ad565;
    }
LAB_001ad586:
    if ((*local_78.data != 0x67452301) && (kj::_::Debug::minSeverity < 3)) {
      uVar1 = *local_78.data;
LAB_001ad5a9:
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x67452301);
      local_80 = CONCAT44(local_80._4_4_,uVar1);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x40,ERROR,
                 "\"failed: expected \" \"(0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS))\", 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS))",
                 (uint *)&local_48,(uint *)&local_80);
    }
    if (local_78.dataSize < 0x40) {
      if (2 < kj::_::Debug::minSeverity) goto LAB_001ad6ba;
      uVar1 = 0;
LAB_001ad626:
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0xefcdab89);
      local_80 = CONCAT44(local_80._4_4_,uVar1);
      kj::_::Debug::log<char_const(&)[80],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x41,ERROR,
                 "\"failed: expected \" \"(0xefcdab89u) == (reader.getDataField<uint32_t>(1 * ELEMENTS))\", 0xefcdab89u, reader.getDataField<uint32_t>(1 * ELEMENTS)"
                 ,(char (*) [80])
                  "failed: expected (0xefcdab89u) == (reader.getDataField<uint32_t>(1 * ELEMENTS))",
                 (uint *)&local_48,(uint *)&local_80);
    }
    else {
      uVar1 = *(uint *)((long)local_78.data + 4);
      if ((uVar1 != 0xefcdab89) && (kj::_::Debug::minSeverity < 3)) goto LAB_001ad626;
    }
    if (local_78.dataSize < 0x60) goto LAB_001ad6ba;
    if (((uint)*(ulong *)((long)local_78.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_48.segment = (SegmentReader *)((ulong)local_48.segment & 0xffffffff00000000);
      local_80 = CONCAT44(local_80._4_4_,(uint)*(ulong *)((long)local_78.data + 8));
      kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x42,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))\", 0u, reader.getDataField<uint32_t>(2 * ELEMENTS)"
                 ,(char (*) [71])
                  "failed: expected (0u) == (reader.getDataField<uint32_t>(2 * ELEMENTS))",
                 (uint *)&local_48,(uint *)&local_80);
      goto LAB_001ad6ba;
    }
LAB_001ad6db:
    uVar2 = *local_78.data;
    if ((uVar2 != 0x2301) && (kj::_::Debug::minSeverity < 3)) {
LAB_001ad6ff:
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x2301);
      local_80 = CONCAT62(local_80._2_6_,uVar2);
      kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x43,ERROR,
                 "\"failed: expected \" \"(0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS))\", 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS)"
                 ,(char (*) [76])
                  "failed: expected (0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS))",
                 (uint *)&local_48,(unsigned_short *)&local_80);
    }
    if (local_78.dataSize < 0x20) {
      if (kj::_::Debug::minSeverity < 3) {
        uVar2 = 0;
LAB_001ad77e:
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x6745);
        local_80 = CONCAT62(local_80._2_6_,uVar2);
        kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x44,ERROR,
                   "\"failed: expected \" \"(0x6745u) == (reader.getDataField<uint16_t>(1 * ELEMENTS))\", 0x6745u, reader.getDataField<uint16_t>(1 * ELEMENTS)"
                   ,(char (*) [76])
                    "failed: expected (0x6745u) == (reader.getDataField<uint16_t>(1 * ELEMENTS))",
                   (uint *)&local_48,(unsigned_short *)&local_80);
        goto LAB_001ad7b7;
      }
LAB_001ada1d:
      if (0xf < local_78.dataSize) goto LAB_001ada40;
      if (2 < kj::_::Debug::minSeverity) goto LAB_001adbc9;
      uVar2 = 0x141;
LAB_001ada6a:
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x2240);
      local_80 = CONCAT62(local_80._2_6_,uVar2);
      kj::_::Debug::log<char_const(&)[89],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x4b,ERROR,
                 "\"failed: expected \" \"(321u ^ 0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS, 321u))\", 321u ^ 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS, 321u)"
                 ,(char (*) [89])
                  "failed: expected (321u ^ 0x2301u) == (reader.getDataField<uint16_t>(0 * ELEMENTS, 321u))"
                 ,(uint *)&local_48,(unsigned_short *)&local_80);
    }
    else {
      uVar2 = *(ushort *)((long)local_78.data + 2);
      if ((uVar2 != 0x6745) && (kj::_::Debug::minSeverity < 3)) goto LAB_001ad77e;
LAB_001ad7b7:
      if (local_78.dataSize < 0x30) {
        if (kj::_::Debug::minSeverity < 3) {
          uVar2 = 0;
          goto LAB_001ad7fd;
        }
LAB_001ad99d:
        if (0x1f < local_78.dataSize) goto LAB_001ad9bd;
        if (2 < kj::_::Debug::minSeverity) goto LAB_001ada1d;
        uVar1 = 0x141;
LAB_001ad9e5:
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x67452240);
        local_80 = CONCAT44(local_80._4_4_,uVar1);
        kj::_::Debug::log<char_const(&)[93],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x4a,ERROR,
                   "\"failed: expected \" \"(321u ^ 0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS, 321u))\", 321u ^ 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS, 321u)"
                   ,(char (*) [93])
                    "failed: expected (321u ^ 0x67452301u) == (reader.getDataField<uint32_t>(0 * ELEMENTS, 321u))"
                   ,(uint *)&local_48,(uint *)&local_80);
        goto LAB_001ada1d;
      }
      uVar2 = *(ushort *)((long)local_78.data + 4);
      if ((uVar2 != 0xab89) && (kj::_::Debug::minSeverity < 3)) {
LAB_001ad7fd:
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0xab89);
        local_80 = CONCAT62(local_80._2_6_,uVar2);
        kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x45,ERROR,
                   "\"failed: expected \" \"(0xab89u) == (reader.getDataField<uint16_t>(2 * ELEMENTS))\", 0xab89u, reader.getDataField<uint16_t>(2 * ELEMENTS)"
                   ,(char (*) [76])
                    "failed: expected (0xab89u) == (reader.getDataField<uint16_t>(2 * ELEMENTS))",
                   (uint *)&local_48,(unsigned_short *)&local_80);
      }
      if (local_78.dataSize < 0x40) {
        if (2 < kj::_::Debug::minSeverity) goto LAB_001ad99d;
        uVar2 = 0;
LAB_001ad87c:
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0xefcd);
        local_80 = CONCAT62(local_80._2_6_,uVar2);
        kj::_::Debug::log<char_const(&)[76],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x46,ERROR,
                   "\"failed: expected \" \"(0xefcdu) == (reader.getDataField<uint16_t>(3 * ELEMENTS))\", 0xefcdu, reader.getDataField<uint16_t>(3 * ELEMENTS)"
                   ,(char (*) [76])
                    "failed: expected (0xefcdu) == (reader.getDataField<uint16_t>(3 * ELEMENTS))",
                   (uint *)&local_48,(unsigned_short *)&local_80);
      }
      else {
        uVar2 = *(ushort *)((long)local_78.data + 6);
        if ((uVar2 != 0xefcd) && (kj::_::Debug::minSeverity < 3)) goto LAB_001ad87c;
      }
      if (local_78.dataSize < 0x50) {
LAB_001ad914:
        if (0x3f < local_78.dataSize) goto LAB_001ad938;
        if (2 < kj::_::Debug::minSeverity) goto LAB_001ad99d;
        local_80 = 0x141;
LAB_001ad964:
        local_48.segment = (SegmentReader *)0xefcdab8967452240;
        kj::_::Debug::log<char_const(&)[103],unsigned_long_long,unsigned_long>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x49,ERROR,
                   "\"failed: expected \" \"(321u ^ 0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS, 321u))\", 321u ^ 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS, 321u)"
                   ,(char (*) [103])
                    "failed: expected (321u ^ 0xefcdab8967452301ull) == (reader.getDataField<uint64_t>(0 * ELEMENTS, 321u))"
                   ,(unsigned_long_long *)&local_48,&local_80);
        goto LAB_001ad99d;
      }
      if (((ushort)*(ulong *)((long)local_78.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
        local_48.segment = (SegmentReader *)((ulong)local_48.segment & 0xffffffff00000000);
        local_80 = CONCAT62(local_80._2_6_,(ushort)*(ulong *)((long)local_78.data + 8));
        kj::_::Debug::log<char_const(&)[71],unsigned_int,unsigned_short>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x47,ERROR,
                   "\"failed: expected \" \"(0u) == (reader.getDataField<uint16_t>(4 * ELEMENTS))\", 0u, reader.getDataField<uint16_t>(4 * ELEMENTS)"
                   ,(char (*) [71])
                    "failed: expected (0u) == (reader.getDataField<uint16_t>(4 * ELEMENTS))",
                   (uint *)&local_48,(unsigned_short *)&local_80);
        goto LAB_001ad914;
      }
LAB_001ad938:
      if ((*local_78.data != 0xefcdab8967452301) && (kj::_::Debug::minSeverity < 3)) {
        local_80 = *local_78.data ^ 0x141;
        goto LAB_001ad964;
      }
LAB_001ad9bd:
      if ((*local_78.data != 0x67452301) && (kj::_::Debug::minSeverity < 3)) {
        uVar1 = *local_78.data ^ 0x141;
        goto LAB_001ad9e5;
      }
LAB_001ada40:
      if ((*local_78.data != 0x2301) && (kj::_::Debug::minSeverity < 3)) {
        uVar2 = *local_78.data ^ 0x141;
        goto LAB_001ada6a;
      }
    }
    if (local_78.dataSize < 0x80) {
LAB_001adb08:
      if (0x5f < local_78.dataSize) goto LAB_001adb0d;
LAB_001adb67:
      if (local_78.dataSize < 0x50) goto LAB_001adbc9;
    }
    else {
      if ((*(ulong *)((long)local_78.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
        local_80 = CONCAT44(local_80._4_4_,0x141);
        local_48.segment = (SegmentReader *)(*(ulong *)((long)local_78.data + 8) ^ 0x141);
        kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_long>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x4c,ERROR,
                   "\"failed: expected \" \"(321u) == (reader.getDataField<uint64_t>(1 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint64_t>(1 * ELEMENTS, 321u)"
                   ,(char (*) [79])
                    "failed: expected (321u) == (reader.getDataField<uint64_t>(1 * ELEMENTS, 321u))"
                   ,(uint *)&local_80,(unsigned_long *)&local_48);
        goto LAB_001adb08;
      }
LAB_001adb0d:
      if (((uint)*(ulong *)((long)local_78.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
        local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x141);
        local_80 = CONCAT44(local_80._4_4_,(uint)*(ulong *)((long)local_78.data + 8)) ^ 0x141;
        kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_int>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x4d,ERROR,
                   "\"failed: expected \" \"(321u) == (reader.getDataField<uint32_t>(2 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint32_t>(2 * ELEMENTS, 321u)"
                   ,(char (*) [79])
                    "failed: expected (321u) == (reader.getDataField<uint32_t>(2 * ELEMENTS, 321u))"
                   ,(uint *)&local_48,(uint *)&local_80);
        goto LAB_001adb67;
      }
    }
    if (((ushort)*(ulong *)((long)local_78.data + 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_48.segment = (SegmentReader *)CONCAT44(local_48.segment._4_4_,0x141);
      local_80 = CONCAT62(local_80._2_6_,(ushort)*(ulong *)((long)local_78.data + 8)) ^ 0x141;
      kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x4e,ERROR,
                 "\"failed: expected \" \"(321u) == (reader.getDataField<uint16_t>(4 * ELEMENTS, 321u))\", 321u, reader.getDataField<uint16_t>(4 * ELEMENTS, 321u)"
                 ,(char (*) [79])
                  "failed: expected (321u) == (reader.getDataField<uint16_t>(4 * ELEMENTS, 321u))",
                 (uint *)&local_48,(unsigned_short *)&local_80);
      goto LAB_001adbc9;
    }
LAB_001adbcd:
    if ((*local_78.data & 1) == 0 && kj::_::Debug::minSeverity < 3) goto LAB_001adbff;
  }
  if (local_78.dataSize < 2) {
LAB_001ade57:
    if (kj::_::Debug::minSeverity < 3) {
LAB_001ade5c:
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5a,ERROR,"\"failed: expected \" \"reader.getDataField<bool>( 8 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>( 8 * ELEMENTS)");
      goto LAB_001ade84;
    }
LAB_001adeac:
    if (kj::_::Debug::minSeverity < 3) {
LAB_001adebc:
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5b,ERROR,"\"failed: expected \" \"reader.getDataField<bool>( 9 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>( 9 * ELEMENTS)");
      goto LAB_001adeed;
    }
LAB_001ae146:
    if (local_78.dataSize != 0) goto LAB_001ae14a;
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
LAB_001ae17c:
    kj::_::Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x66,ERROR,
               "\"failed: expected \" \"reader.getDataField<bool>(0 * ELEMENTS, false)\"",
               (char (*) [64])"failed: expected reader.getDataField<bool>(0 * ELEMENTS, false)");
  }
  else {
    if ((kj::_::Debug::minSeverity < 3 & *local_78.data >> 1) == 1) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x52,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(1 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(1 * ELEMENTS))");
    }
    if (local_78.dataSize < 3) goto LAB_001ade57;
    if ((kj::_::Debug::minSeverity < 3 & *local_78.data >> 2) == 1) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x53,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(2 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(2 * ELEMENTS))");
    }
    if (local_78.dataSize < 4) goto LAB_001ade57;
    if (((*local_78.data & 8) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x54,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(3 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(3 * ELEMENTS))");
    }
    if (local_78.dataSize < 5) goto LAB_001ade57;
    if (((*local_78.data & 0x10) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x55,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(4 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(4 * ELEMENTS))");
    }
    if (local_78.dataSize < 6) goto LAB_001ade57;
    if (((*local_78.data & 0x20) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x56,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(5 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(5 * ELEMENTS))");
    }
    if (local_78.dataSize < 7) goto LAB_001ade57;
    if (((*local_78.data & 0x40) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x57,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(6 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(6 * ELEMENTS))");
    }
    if (local_78.dataSize < 8) goto LAB_001ade57;
    if (((char)*local_78.data < '\0') && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[60]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x58,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(7 * ELEMENTS))\"",
                 (char (*) [60])"failed: expected !(reader.getDataField<bool>(7 * ELEMENTS))");
    }
    if (local_78.dataSize < 9) goto LAB_001ade57;
    if (((*(byte *)((long)local_78.data + 1) & 1) == 0) && (kj::_::Debug::minSeverity < 3))
    goto LAB_001ade5c;
LAB_001ade84:
    if (local_78.dataSize < 10) goto LAB_001adeac;
    if ((*(byte *)((long)local_78.data + 1) & 2) == 0 && kj::_::Debug::minSeverity < 3)
    goto LAB_001adebc;
LAB_001adeed:
    if (local_78.dataSize < 0xb) {
LAB_001adff4:
      if (2 < kj::_::Debug::minSeverity) goto LAB_001ae146;
LAB_001adffd:
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x5f,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(13 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>(13 * ELEMENTS)");
    }
    else {
      if ((kj::_::Debug::minSeverity < 3 & *(byte *)((long)local_78.data + 1) >> 2) == 1) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x5c,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(10 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(10 * ELEMENTS))");
      }
      if (local_78.dataSize < 0xc) goto LAB_001adff4;
      if ((kj::_::Debug::minSeverity < 3 & *(byte *)((long)local_78.data + 1) >> 3) == 1) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x5d,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(11 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(11 * ELEMENTS))");
      }
      if (local_78.dataSize < 0xd) goto LAB_001adff4;
      if (((*(byte *)((long)local_78.data + 1) & 0x10) != 0) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x5e,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(12 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(12 * ELEMENTS))");
      }
      if (local_78.dataSize < 0xe) goto LAB_001adff4;
      if (((*(byte *)((long)local_78.data + 1) & 0x20) == 0) && (kj::_::Debug::minSeverity < 3))
      goto LAB_001adffd;
    }
    if (local_78.dataSize < 0xf) {
LAB_001ae0d5:
      if (2 < kj::_::Debug::minSeverity) goto LAB_001ae146;
LAB_001ae0da:
      kj::_::Debug::log<char_const(&)[58]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,99,ERROR,"\"failed: expected \" \"reader.getDataField<bool>(63 * ELEMENTS)\"",
                 (char (*) [58])"failed: expected reader.getDataField<bool>(63 * ELEMENTS)");
    }
    else {
      if (((*(byte *)((long)local_78.data + 1) & 0x40) != 0) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x60,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(14 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(14 * ELEMENTS))");
      }
      if (local_78.dataSize < 0x10) goto LAB_001ae0d5;
      if (((char)*(byte *)((long)local_78.data + 1) < '\0') && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[61]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                   ,0x61,ERROR,
                   "\"failed: expected \" \"!(reader.getDataField<bool>(15 * ELEMENTS))\"",
                   (char (*) [61])"failed: expected !(reader.getDataField<bool>(15 * ELEMENTS))");
      }
      if (local_78.dataSize < 0x40) goto LAB_001ae0d5;
      if ((-1 < (char)*(byte *)((long)local_78.data + 7)) && (kj::_::Debug::minSeverity < 3))
      goto LAB_001ae0da;
    }
    if (local_78.dataSize < 0x41) goto LAB_001ae146;
    if (((*(ulong *)((long)local_78.data + 8) & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[61]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,100,ERROR,"\"failed: expected \" \"!(reader.getDataField<bool>(64 * ELEMENTS))\"",
                 (char (*) [61])"failed: expected !(reader.getDataField<bool>(64 * ELEMENTS))");
      goto LAB_001ae146;
    }
LAB_001ae14a:
    if ((*local_78.data & 1) == 0 && kj::_::Debug::minSeverity < 3) goto LAB_001ae17c;
  }
  if (local_78.dataSize < 2) {
LAB_001ae219:
    if (kj::_::Debug::minSeverity < 3) {
LAB_001ae21e:
      kj::_::Debug::log<char_const(&)[65]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x68,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(63 * ELEMENTS, false)\"",
                 (char (*) [65])"failed: expected reader.getDataField<bool>(63 * ELEMENTS, false)");
      goto LAB_001ae246;
    }
LAB_001ae28a:
    if (local_78.dataSize != 0) goto LAB_001ae28e;
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
LAB_001ae2c0:
    kj::_::Debug::log<char_const(&)[66]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x6a,ERROR,
               "\"failed: expected \" \"!(reader.getDataField<bool>(0 * ELEMENTS, true))\"",
               (char (*) [66])"failed: expected !(reader.getDataField<bool>(0 * ELEMENTS, true))");
  }
  else {
    if ((kj::_::Debug::minSeverity < 3 & *local_78.data >> 1) == 1) {
      kj::_::Debug::log<char_const(&)[67]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x67,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(1 * ELEMENTS, false))\"",
                 (char (*) [67])"failed: expected !(reader.getDataField<bool>(1 * ELEMENTS, false))"
                );
    }
    if (local_78.dataSize < 0x40) goto LAB_001ae219;
    if (-1 < (char)*(byte *)((long)local_78.data + 7) && kj::_::Debug::minSeverity < 3)
    goto LAB_001ae21e;
LAB_001ae246:
    if (local_78.dataSize < 0x41) goto LAB_001ae28a;
    if (((*(ulong *)((long)local_78.data + 8) & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[68]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x69,ERROR,
                 "\"failed: expected \" \"!(reader.getDataField<bool>(64 * ELEMENTS, false))\"",
                 (char (*) [68])
                 "failed: expected !(reader.getDataField<bool>(64 * ELEMENTS, false))");
      goto LAB_001ae28a;
    }
LAB_001ae28e:
    if ((*local_78.data & 1) == 0 && kj::_::Debug::minSeverity < 3) goto LAB_001ae2c0;
  }
  if (local_78.dataSize < 2) {
LAB_001ae35d:
    if (2 < kj::_::Debug::minSeverity) {
      return;
    }
  }
  else {
    if ((kj::_::Debug::minSeverity < 3 & *local_78.data >> 1) == 1) {
      kj::_::Debug::log<char_const(&)[63]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
                 ,0x6b,ERROR,
                 "\"failed: expected \" \"reader.getDataField<bool>(1 * ELEMENTS, true)\"",
                 (char (*) [63])"failed: expected reader.getDataField<bool>(1 * ELEMENTS, true)");
    }
    if (local_78.dataSize < 0x40) goto LAB_001ae35d;
    if ((char)*(byte *)((long)local_78.data + 7) < '\0' || 2 < kj::_::Debug::minSeverity)
    goto LAB_001ae38a;
  }
  kj::_::Debug::log<char_const(&)[67]>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
             ,0x6c,ERROR,
             "\"failed: expected \" \"!(reader.getDataField<bool>(63 * ELEMENTS, true))\"",
             (char (*) [67])"failed: expected !(reader.getDataField<bool>(63 * ELEMENTS, true))");
LAB_001ae38a:
  if (((0x40 < local_78.dataSize) && ((*(ulong *)((long)local_78.data + 8) & 1) != 0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[64]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"reader.getDataField<bool>(64 * ELEMENTS, true)\"",
               (char (*) [64])"failed: expected reader.getDataField<bool>(64 * ELEMENTS, true)");
  }
  return;
}

Assistant:

TEST(WireFormat, SimpleRawDataStruct) {
  AlignedData<2> data = {{
    // Struct ref, offset = 1, dataSize = 1, pointerCount = 0
    0x00, 0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x00,
    // Content for the data section.
    0x01, 0x23, 0x45, 0x67, 0x89, 0xab, 0xcd, 0xef
  }};

  StructReader reader = PointerReader::getRootUnchecked(data.words).getStruct(nullptr);

  EXPECT_EQ(0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint64_t>(1 * ELEMENTS));
  EXPECT_EQ(0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS));
  EXPECT_EQ(0xefcdab89u, reader.getDataField<uint32_t>(1 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint32_t>(2 * ELEMENTS));
  EXPECT_EQ(0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS));
  EXPECT_EQ(0x6745u, reader.getDataField<uint16_t>(1 * ELEMENTS));
  EXPECT_EQ(0xab89u, reader.getDataField<uint16_t>(2 * ELEMENTS));
  EXPECT_EQ(0xefcdu, reader.getDataField<uint16_t>(3 * ELEMENTS));
  EXPECT_EQ(0u, reader.getDataField<uint16_t>(4 * ELEMENTS));

  EXPECT_EQ(321u ^ 0xefcdab8967452301ull, reader.getDataField<uint64_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u ^ 0x67452301u, reader.getDataField<uint32_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u ^ 0x2301u, reader.getDataField<uint16_t>(0 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint64_t>(1 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint32_t>(2 * ELEMENTS, 321u));
  EXPECT_EQ(321u, reader.getDataField<uint16_t>(4 * ELEMENTS, 321u));

  // Bits
  EXPECT_TRUE (reader.getDataField<bool>(0 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(1 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(2 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(3 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(4 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(5 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(6 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(7 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>( 8 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>( 9 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(10 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(11 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(12 * ELEMENTS));
  EXPECT_TRUE (reader.getDataField<bool>(13 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(14 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(15 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>(63 * ELEMENTS));
  EXPECT_FALSE(reader.getDataField<bool>(64 * ELEMENTS));

  EXPECT_TRUE (reader.getDataField<bool>(0 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(1 * ELEMENTS, false));
  EXPECT_TRUE (reader.getDataField<bool>(63 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(64 * ELEMENTS, false));
  EXPECT_FALSE(reader.getDataField<bool>(0 * ELEMENTS, true));
  EXPECT_TRUE (reader.getDataField<bool>(1 * ELEMENTS, true));
  EXPECT_FALSE(reader.getDataField<bool>(63 * ELEMENTS, true));
  EXPECT_TRUE (reader.getDataField<bool>(64 * ELEMENTS, true));
}